

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O2

Belief * __thiscall despot::LaserTag::InitialBelief(LaserTag *this,State *start,string type)

{
  int iVar1;
  int iVar2;
  int iVar3;
  StateIndexer *pSVar4;
  int iVar5;
  int opp;
  int iVar6;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  State *local_50;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_48;
  
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = despot::Floor::NumCells();
  iVar5 = 0;
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  for (; iVar5 != iVar2; iVar5 = iVar5 + 1) {
    for (iVar6 = 0; iVar1 != iVar6; iVar6 = iVar6 + 1) {
      iVar3 = despot::Floor::NumCells();
      local_50 = (State *)(**(code **)(*(long *)&this->super_BaseTag + 0xe0))
                                    ((1.0 / (double)iVar1) / (double)iVar1,this,
                                     iVar3 * iVar5 + iVar6);
      std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                ((vector<despot::State*,std::allocator<despot::State*>> *)&particles,&local_50);
    }
  }
  pSVar4 = (StateIndexer *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_48,&particles);
  despot::ParticleBelief::ParticleBelief
            ((ParticleBelief *)pSVar4,&local_48,&(this->super_BaseTag).super_BeliefMDP,0,1);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_48);
  despot::ParticleBelief::state_indexer(pSVar4);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
            (&particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>);
  return (Belief *)pSVar4;
}

Assistant:

Belief* LaserTag::InitialBelief(const State* start, string type) const {
	//assert(start != NULL);

	vector<State*> particles;
	int N = floor_.NumCells();
	double wgt = 1.0 / N / N;
	for (int rob = 0; rob < N; rob++) {
		for (int opp = 0; opp < N; opp++) {
			TagState* state = static_cast<TagState*>(Allocate(
				RobOppIndicesToStateIndex(rob, opp), wgt));
			particles.push_back(state);
		}
	}

	ParticleBelief* belief = new ParticleBelief(particles, this);
	belief->state_indexer(this);
	return belief;
}